

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O1

EVP_MD * GetDigest(FileTest *t,string *name)

{
  long lVar1;
  int iVar2;
  EVP_MD *pEVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  AssertHelper local_18;
  
  iVar2 = std::__cxx11::string::compare((char *)t);
  if (iVar2 == 0) {
    pEVar3 = EVP_md5();
    return (EVP_MD *)pEVar3;
  }
  iVar2 = std::__cxx11::string::compare((char *)t);
  if (iVar2 == 0) {
    pEVar3 = EVP_sha1();
    return (EVP_MD *)pEVar3;
  }
  iVar2 = std::__cxx11::string::compare((char *)t);
  if (iVar2 == 0) {
    pEVar3 = EVP_sha224();
    return (EVP_MD *)pEVar3;
  }
  iVar2 = std::__cxx11::string::compare((char *)t);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)t);
    if (iVar2 == 0) {
      pEVar3 = EVP_sha384();
      return (EVP_MD *)pEVar3;
    }
    iVar2 = std::__cxx11::string::compare((char *)t);
    if (iVar2 != 0) {
      testing::Message::Message((Message *)&local_20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_20._M_head_impl + 0x10),"Unknown digest: ",0x10);
      lVar1._0_4_ = t->line_;
      lVar1._4_4_ = t->start_line_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_20._M_head_impl + 0x10),
                 (char *)(t->reader_)._M_t.
                         super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>
                         .super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl,lVar1);
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                 ,0x3e,"Failed");
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if (local_20._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20._M_head_impl + 8))();
      }
      return (EVP_MD *)0x0;
    }
    pEVar3 = EVP_sha512();
    return (EVP_MD *)pEVar3;
  }
  pEVar3 = EVP_sha256();
  return (EVP_MD *)pEVar3;
}

Assistant:

static const EVP_MD *GetDigest(FileTest *t, const std::string &name) {
  if (name == "MD5") {
    return EVP_md5();
  } else if (name == "SHA1") {
    return EVP_sha1();
  } else if (name == "SHA224") {
    return EVP_sha224();
  } else if (name == "SHA256") {
    return EVP_sha256();
  } else if (name == "SHA384") {
    return EVP_sha384();
  } else if (name == "SHA512") {
    return EVP_sha512();
  }
  ADD_FAILURE() << "Unknown digest: " << name;
  return nullptr;
}